

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O3

void __thiscall
transition_guard_moved_into_transition_size_Test::TestBody
          (transition_guard_moved_into_transition_size_Test *this)

{
  return;
}

Assistant:

TEST(transition, guard_moved_into_transition_size) {
    static constexpr int threshold = 42;

    auto transition = make_transition(
        state<s1>,
        event<e2>,
        [x = std::make_unique<int>(threshold)](const e2 e) { return e.value > *x; },
        _,
        _);

    EXPECT_FALSE(transition.guard(e2{threshold}));
    EXPECT_TRUE(transition.guard(e2{threshold + 1}));
}